

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

bool spdlog::details::os::is_color_terminal(void)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char **local_28;
  char *env_p;
  
  env_p = getenv("TERM");
  if (env_p == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = is_color_terminal::result;
    if ((is_color_terminal()::result == '\0') &&
       (iVar4 = __cxa_guard_acquire(&is_color_terminal()::result), uVar1 = is_color_terminal::result
       , iVar4 != 0)) {
      local_28 = &env_p;
      for (lVar5 = 0x18; lVar5 != 0x78; lVar5 = lVar5 + 0x20) {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::$_0>::
                operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0> *)&local_28,
                           (char **)((long)&spdlog_ex::typeinfo + lVar5));
        if (bVar2) {
          lVar5 = lVar5 + -0x18;
LAB_0015a7aa:
          bVar2 = lVar5 != 0x70;
          goto LAB_0015a7b1;
        }
        bVar2 = __gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::$_0>::
                operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0> *)&local_28,
                           (char **)((long)&PTR_typeinfo_name_001b4dc8 + lVar5));
        if (bVar2) {
          lVar5 = lVar5 + -0x10;
          goto LAB_0015a7aa;
        }
        bVar2 = __gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::$_0>::
                operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0> *)&local_28,
                           (char **)((long)&PTR_typeinfo_001b4dd0 + lVar5));
        if (bVar2) {
          lVar5 = lVar5 + -8;
          goto LAB_0015a7aa;
        }
        bVar2 = __gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::$_0>::
                operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0> *)&local_28,
                           (char **)((long)is_color_terminal::Terms._M_elems + lVar5));
        if (bVar2) goto LAB_0015a7aa;
      }
      bVar3 = __gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::$_0>::
              operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0> *)&local_28,
                         is_color_terminal::Terms._M_elems + 0xc);
      bVar2 = true;
      if (!bVar3) {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::$_0>::
                operator()((_Iter_pred<spdlog::details::os::is_color_terminal()::__0> *)&local_28,
                           is_color_terminal::Terms._M_elems + 0xd);
      }
LAB_0015a7b1:
      is_color_terminal::result = bVar2;
      __cxa_guard_release(&is_color_terminal()::result);
      uVar1 = is_color_terminal::result;
    }
  }
  return (bool)uVar1;
}

Assistant:

SPDLOG_INLINE bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else
    static constexpr std::array<const char *, 14> Terms = {
        {"ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux", "msys", "putty", "rxvt", "screen", "vt100", "xterm"}};

    const char *env_p = std::getenv("TERM");
    if (env_p == nullptr)
    {
        return false;
    }

    static const bool result =
        std::any_of(std::begin(Terms), std::end(Terms), [&](const char *term) { return std::strstr(env_p, term) != nullptr; });
    return result;
#endif
}